

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O1

void __thiscall QLabel::setSelection(QLabel *this,int start,int length)

{
  QLabelPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if (this_00->control != (QWidgetTextControl *)0x0) {
    QLabelPrivate::ensureTextPopulated(this_00);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::textCursor((QWidgetTextControl *)&local_30);
    iVar1 = (int)(QWidgetTextControl *)&local_30;
    QTextCursor::setPosition(iVar1,start);
    QTextCursor::setPosition(iVar1,length + start);
    QWidgetTextControl::setTextCursor
              ((QWidgetTextControl *)this_00->control,(QTextCursor *)&local_30,false);
    QTextCursor::~QTextCursor((QTextCursor *)&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabel::setSelection(int start, int length)
{
    Q_D(QLabel);
    if (d->control) {
        d->ensureTextPopulated();
        QTextCursor cursor = d->control->textCursor();
        cursor.setPosition(start);
        cursor.setPosition(start + length, QTextCursor::KeepAnchor);
        d->control->setTextCursor(cursor);
    }
}